

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_dead_builtin_varyings.cpp
# Opt level: O0

ir_visitor_status __thiscall
anon_unknown.dwarf_11f0f1::varying_info_visitor::visit(varying_info_visitor *this,ir_variable *var)

{
  ir_variable *var_local;
  varying_info_visitor *this_local;
  
  if (((*(uint *)&var->data >> 0xc & (ir_var_mode_count|ir_var_shader_shared)) == this->mode) &&
     ((this->find_frag_outputs & 1U) == 0)) {
    switch((var->data).location) {
    case 1:
      this->color[0] = var;
      this->color_usage = this->color_usage | 1;
      break;
    case 2:
      this->color[1] = var;
      this->color_usage = this->color_usage | 2;
      break;
    case 3:
      this->fog = var;
      this->has_fog = true;
      break;
    case 0xd:
      this->backcolor[0] = var;
      this->color_usage = this->color_usage | 1;
      break;
    case 0xe:
      this->backcolor[1] = var;
      this->color_usage = this->color_usage | 2;
    }
  }
  return visit_continue;
}

Assistant:

virtual ir_visitor_status visit(ir_variable *var)
   {
      if (var->data.mode != this->mode)
         return visit_continue;

      /* Nothing to do here for fragment outputs. */
      if (this->find_frag_outputs)
         return visit_continue;

      /* Handle colors and fog. */
      switch (var->data.location) {
      case VARYING_SLOT_COL0:
         this->color[0] = var;
         this->color_usage |= 1;
         break;
      case VARYING_SLOT_COL1:
         this->color[1] = var;
         this->color_usage |= 2;
         break;
      case VARYING_SLOT_BFC0:
         this->backcolor[0] = var;
         this->color_usage |= 1;
         break;
      case VARYING_SLOT_BFC1:
         this->backcolor[1] = var;
         this->color_usage |= 2;
         break;
      case VARYING_SLOT_FOGC:
         this->fog = var;
         this->has_fog = true;
         break;
      }

      return visit_continue;
   }